

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

double __thiscall Noise::generateRandomGaussian(Noise *this,double mean,double StandardDerivation)

{
  int iVar1;
  double dVar2;
  bool local_29;
  double local_28;
  double x;
  double StandardDerivation_local;
  double mean_local;
  Noise *this_local;
  
  local_28 = generateRandomGaussian::v2;
  if (generateRandomGaussian::phase == 0) {
    do {
      iVar1 = rand();
      generateRandomGaussian::v1 = ((double)iVar1 * 2.0) / 2147483647.0 + -1.0;
      iVar1 = rand();
      local_28 = generateRandomGaussian::v1;
      generateRandomGaussian::v2 = ((double)iVar1 * 2.0) / 2147483647.0 + -1.0;
      generateRandomGaussian::s =
           generateRandomGaussian::v1 * generateRandomGaussian::v1 +
           generateRandomGaussian::v2 * generateRandomGaussian::v2;
      local_29 = 1.0 <= generateRandomGaussian::s || generateRandomGaussian::s == 0.0;
    } while (local_29);
    dVar2 = log(generateRandomGaussian::s);
    dVar2 = sqrt((dVar2 * -2.0) / generateRandomGaussian::s);
    local_28 = local_28 * dVar2;
  }
  else {
    dVar2 = log(generateRandomGaussian::s);
    dVar2 = sqrt((dVar2 * -2.0) / generateRandomGaussian::s);
    local_28 = local_28 * dVar2;
  }
  generateRandomGaussian::phase = 1 - generateRandomGaussian::phase;
  return local_28 * StandardDerivation + mean;
}

Assistant:

double Noise::generateRandomGaussian(double mean, double StandardDerivation)
{
    static double v1, v2, s;
    static int phase = 0;
    double x;

    if(phase == 0)
    {
        do
        {
            v1 = -1 + 2 * (double)rand() / (double) RAND_MAX;
            v2 = -1 + 2 * (double)rand() / (double) RAND_MAX;
            s = v1 * v1 + v2 * v2;
        }while (s >= 1 || s == 0);

        x = v1 * sqrt(-2 * log(s) / s);
    }
    else
        x = v2 * sqrt(-2 * log(s) / s);

    phase = 1 - phase;

    return x * StandardDerivation + mean;
}